

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho_corasick_test.cpp
# Opt level: O2

void __thiscall AC_Valid_Test::AC_Valid_Test(AC_Valid_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014e380;
  return;
}

Assistant:

TEST(AC, Valid) {
	rep(i, 0, 20) {
		string s = gen(1000, i / 2 + 1);
		set<string> needles;
		rep(j, 0, 10)
			needles.insert(gen(rand() % 8 + 1, i / 2 + 1));

		vector<string> n;
		for (auto a : needles)
			n.push_back(a);

		se = {};
		ac(s, n);
		rep(j, 0, n.size())
			rep(k, 0, s.size())
				EXPECT_EQ(matches(s, n[j], k), se.count({k, j}));
	}
}